

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  undefined8 uVar1;
  size_type *psVar2;
  long lVar3;
  undefined1 auVar4 [8];
  size_type *psVar5;
  char cVar6;
  istream *this;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long *plVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  ulong uVar17;
  undefined8 uStack_b0;
  int aiStack_a8 [2];
  long local_a0;
  undefined1 *local_98;
  ulong local_90;
  int local_88;
  int local_84;
  int N;
  int X;
  int Y;
  undefined1 local_70 [8];
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> lake;
  int W;
  int H;
  string row;
  
  uStack_b0 = 0x101283;
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)&lake.
                     super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl._M_node._M_size);
  uStack_b0 = 0x10128b;
  std::istream::ignore();
  uStack_b0 = 0x10129a;
  std::istream::operator>>
            ((istream *)&std::cin,
             (int *)((long)&lake.
                            super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl._M_node._M_size + 4));
  uStack_b0 = 0x1012a2;
  std::istream::ignore();
  uVar17 = (ulong)lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl._M_node._M_size._4_4_;
  lVar3 = -((uint)lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl._M_node._M_size * uVar17 * 4 + 0xf & 0xfffffffffffffff0);
  piVar15 = (int *)((long)aiStack_a8 + lVar3);
  local_98 = (undefined1 *)aiStack_a8;
  _Y = piVar15;
  if (0 < (int)lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl._M_node._M_size._4_4_) {
    lVar14 = 0;
    local_98 = (undefined1 *)aiStack_a8;
    do {
      _W = &row._M_string_length;
      row._M_dataplus._M_p = (pointer)0x0;
      row._M_string_length = row._M_string_length & 0xffffffffffffff00;
      uVar1 = *(undefined8 *)(std::cin + -0x18);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10130f;
      cVar6 = std::ios::widen((char)uVar1 + -0x70);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10131e;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&W,cVar6);
      psVar5 = _W;
      if (row._M_dataplus._M_p !=
          (pointer)(long)(int)(uint)lake.
                                    super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl._M_node._M_size) {
        *(undefined1 **)((long)aiStack_a8 + lVar3 + -8) = &LAB_001016ba;
        __assert_fail("static_cast<size_t>(W) == row.length()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/surface/main.cpp"
                      ,0x1b,"int main()");
      }
      if (0 < (int)(uint)row._M_dataplus._M_p) {
        uVar12 = 0;
        piVar10 = piVar15;
        do {
          *piVar10 = -(uint)(*(char *)((long)_W + uVar12) == 'O');
          uVar12 = uVar12 + 1;
          piVar10 = piVar10 + uVar17;
        } while (((uint)row._M_dataplus._M_p & 0x7fffffff) != uVar12);
      }
      if (_W != &row._M_string_length) {
        uVar12 = row._M_string_length + 1;
        *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101373;
        operator_delete(psVar5,uVar12);
      }
      lVar14 = lVar14 + 1;
      piVar15 = piVar15 + 1;
    } while (lVar14 < (int)lake.
                           super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                           ._M_impl._M_node._M_size._4_4_);
  }
  *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10139d;
  std::istream::operator>>((istream *)&std::cin,&local_88);
  *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1013a5;
  std::istream::ignore();
  if (0 < local_88) {
    iVar11 = 0;
    local_90 = uVar17;
    do {
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1013d0;
      this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_84);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1013dc;
      std::istream::operator>>(this,&N);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1013e4;
      std::istream::ignore();
      iVar16 = N;
      iVar13 = _Y[(long)local_84 * uVar17 + (long)N];
      if (iVar13 == -1) {
        row._M_string_length = 0;
        local_70 = (undefined1  [8])local_70;
        lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
        local_a0 = (long)local_84;
        X = iVar11;
        lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)local_70;
        _W = (size_type *)&W;
        row._M_dataplus._M_p = (pointer)&W;
        *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10143b;
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = (_List_node_base *)CONCAT44(iVar16,(undefined4)local_a0);
        *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10145a;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        row._M_string_length = row._M_string_length + 1;
        iVar13 = 0;
        while (psVar5 = _W, piVar15 = _Y, _W != (size_type *)&W) {
          p_Var7 = (_List_node_base *)_W[2];
          row._M_string_length = row._M_string_length - 1;
          *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101482;
          std::__detail::_List_node_base::_M_unhook();
          *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10148f;
          operator_delete(psVar5,0x18);
          iVar11 = (int)p_Var7;
          if (_Y[(long)iVar11 * uVar17 + ((long)p_Var7 >> 0x20)] == -1) {
            iVar13 = iVar13 + 1;
            _Y[(long)iVar11 * uVar17 + ((long)p_Var7 >> 0x20)] = iVar13;
            *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1014c0;
            p_Var8 = (_List_node_base *)operator_new(0x18);
            uVar12 = (ulong)p_Var7 & 0xffffffff00000000;
            p_Var8[1]._M_next = p_Var7;
            *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1014e0;
            std::__detail::_List_node_base::_M_hook(p_Var8);
            lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev =
                 (_List_node_base *)
                 ((long)&(lake.
                          super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
            if (0 < iVar11) {
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1014f2;
              p_Var8 = (_List_node_base *)operator_new(0x18);
              p_Var8[1]._M_next = (_List_node_base *)(iVar11 - 1 | uVar12);
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10150c;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              row._M_string_length = row._M_string_length + 1;
            }
            iVar16 = (int)((ulong)p_Var7 >> 0x20);
            if (0 < iVar16) {
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101529;
              p_Var8 = (_List_node_base *)operator_new(0x18);
              p_Var8[1]._M_next =
                   (_List_node_base *)(uVar12 - 0x100000000 | (ulong)p_Var7 & 0xffffffff);
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101549;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              row._M_string_length = row._M_string_length + 1;
            }
            if (iVar11 < (int)((uint)lake.
                                     super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     ._M_impl._M_node._M_size - 1)) {
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101560;
              p_Var8 = (_List_node_base *)operator_new(0x18);
              p_Var8[1]._M_next = (_List_node_base *)(iVar11 + 1 | uVar12);
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101575;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              row._M_string_length = row._M_string_length + 1;
            }
            uVar17 = local_90;
            if (iVar16 < (int)(lake.
                               super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl._M_node._M_size._4_4_ - 1)) {
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10158d;
              p_Var8 = (_List_node_base *)operator_new(0x18);
              uVar17 = local_90;
              p_Var8[1]._M_next =
                   (_List_node_base *)(((ulong)p_Var7 & 0xffffffff) + uVar12 + 0x100000000);
              *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x1015b3;
              std::__detail::_List_node_base::_M_hook(p_Var8);
              row._M_string_length = row._M_string_length + 1;
            }
          }
        }
        auVar4 = local_70;
        while (local_70 = auVar4, auVar4 != (undefined1  [8])local_70) {
          piVar15[(long)*(int *)&((_List_node_base *)((long)auVar4 + 0x10))->_M_next * uVar17 +
                  (long)*(int *)((long)&((_List_node_base *)((long)auVar4 + 0x10))->_M_next + 4)] =
               iVar13;
          lake.super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          _M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&lake.
                       super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                       _M_impl._M_node.super__List_node_base._M_prev[-1]._M_prev + 7);
          *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101600;
          std::__detail::_List_node_base::_M_unhook();
          *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10160d;
          operator_delete((void *)auVar4,0x18);
          auVar4 = local_70;
        }
        iVar11 = X;
        psVar5 = _W;
        while (X = iVar11, psVar5 != (size_type *)&W) {
          psVar2 = (size_type *)*psVar5;
          *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101630;
          operator_delete(psVar5,0x18);
          iVar11 = X;
          psVar5 = psVar2;
        }
      }
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x10164a;
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
      uVar1 = *(undefined8 *)(*plVar9 + -0x18);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101661;
      std::ios::widen((char)uVar1 + (char)plVar9);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101670;
      std::ostream::put((char)plVar9);
      *(undefined8 *)((long)aiStack_a8 + lVar3 + -8) = 0x101678;
      std::ostream::flush();
      iVar11 = iVar11 + 1;
    } while (iVar11 < local_88);
  }
  return 0;
}

Assistant:

int main()
{
	int W;
	int H;
	std::cin >> W;
	std::cin.ignore();
	std::cin >> H;
	std::cin.ignore();

typedef std::pair<int, int> pos_t;
    int surf[W][H];
	for (int i = 0; i < H; i++)
	{
	    std::string row;
	    std::getline(std::cin, row);
	    assert(static_cast<size_t>(W) == row.length());
	    int l = row.length();
	    for (int j = 0; j < l; j++)
	    {
	        if ('O' == row[j])
	        {
	            surf[j][i] = -1;
	        }
	        else
	        {
	            surf[j][i] = 0;
	        }
	    }
	}
	
    // Tests
    int N;
    std::cin >> N;
    std::cin.ignore();
	for (int i = 0; i < N; i++)
	{
	    int X;
	    int Y;
	    std::cin >> X >> Y;
	    std::cin.ignore();
	    
	    int result;
	    if (-1 == surf[X][Y])
	    {
	        // Fill
	        result = 0;
	        std::list<pos_t> to_process;
	        std::list<pos_t> lake;
	        
	        to_process.push_back(pos_t(X, Y));
	        while (!to_process.empty())
	        {
	            const pos_t p = to_process.front();
	            to_process.pop_front();
	            if (-1 == surf[p.first][p.second])
	            {
	                result++;
	                surf[p.first][p.second] = result;
	                lake.push_back(p);
	                
	                if (0 < p.first)
	                {
	                    to_process.push_back(pos_t(p.first - 1, p.second));
	                }
	                if (0 < p.second)
	                {
	                    to_process.push_back(pos_t(p.first, p.second - 1));
	                }
	                if (p.first < W - 1)
	                {
	                    to_process.push_back(pos_t(p.first + 1, p.second));
	                }
	                if (p.second < H - 1)
	                {
	                    to_process.push_back(pos_t(p.first, p.second + 1));
	                }
	            }
	        }
	        
	        while (!lake.empty())
	        {
	            const pos_t p = lake.front();
	            surf[p.first][p.second] = result;
	            lake.pop_front();
	        }
	    }
	    else
	    {
	        result = surf[X][Y];
	    }
	    std::cout << result << std::endl;
	}

	return 0;
}